

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Merge_distr_patch64(int g_a,int64_t *alo,int64_t *ahi,int g_b,int64_t *blo,int64_t *bhi)

{
  Integer IVar1;
  Integer IVar2;
  Integer *pIVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer local_128 [7];
  long lStack_f0;
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  IVar2 = pnga_ndim((long)g_b);
  lVar5 = 0;
  lVar4 = 0;
  if (0 < IVar1) {
    lVar4 = IVar1;
  }
  plVar6 = &lStack_70 + IVar1;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *plVar6 = alo[lVar5] + 1;
    plVar6 = plVar6 + -1;
  }
  plVar6 = &lStack_b0 + IVar1;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *plVar6 = ahi[lVar5] + 1;
    plVar6 = plVar6 + -1;
  }
  lVar5 = 0;
  lVar4 = 0;
  if (0 < IVar2) {
    lVar4 = IVar2;
  }
  plVar6 = &lStack_f0 + IVar2;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *plVar6 = blo[lVar5] + 1;
    plVar6 = plVar6 + -1;
  }
  pIVar3 = local_128 + IVar2 + -1;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = bhi[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  pnga_merge_distr_patch((long)g_a,local_68,local_a8,(long)g_b,local_e8,local_128);
  return;
}

Assistant:

void NGA_Merge_distr_patch64(int g_a, int64_t *alo, int64_t *ahi,
                             int g_b, int64_t *blo, int64_t *bhi)
{
    Integer a = (Integer)g_a;
    Integer andim = wnga_ndim(a);

    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);

    wnga_merge_distr_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi);
}